

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O0

void __thiscall
ANN::NearestNeighbor
          (ANN *this,int *topology,ANNpoint scaling,ANNpoint *x,int NumNeighbors,ANNpoint *d_best,
          int **n_best)

{
  long *in_RCX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  long *in_R9;
  double dVar1;
  long *in_stack_00000008;
  int i;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 4); local_34 = local_34 + 1) {
    *(double *)(*(long *)(in_RDI + 0x10) + (long)local_34 * 8) =
         *(double *)(in_RDX + (long)local_34 * 8) * *(double *)(*in_RCX + (long)local_34 * 8);
  }
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
            (*(undefined8 *)(in_RDI + 0x38),*(long **)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x10)
             ,in_R8D,*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20));
  for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
    *(undefined4 *)(*in_stack_00000008 + (long)local_34 * 4) =
         *(undefined4 *)
          (*(long *)(in_RDI + 0x30) +
          (long)*(int *)(*(long *)(in_RDI + 0x18) + (long)local_34 * 4) * 4);
    dVar1 = sqrt(*(double *)(*(long *)(in_RDI + 0x20) + (long)local_34 * 8));
    *(double *)(*in_R9 + (long)local_34 * 8) = dVar1;
  }
  return;
}

Assistant:

void ANN::NearestNeighbor(int *topology, ANNpoint scaling, const ANNpoint &x,
                          int NumNeighbors, ANNpoint &d_best, int *&n_best) {
    int i;

    // Transfer x to query_pt
    for (i = 0; i < dimension; i++) {
        query_pt[i] = scaling[i] * x[i];
    }

    the_tree->annkSearch(query_pt,      // query point
                         NumNeighbors,  // number of near neighbors
                         nn_idx,        // nearest neighbors (returned)
                         dists,         // distance (returned)
                         epsilon);      // error bound

    for (i = 0; i < NumNeighbors; i++) {
        n_best[i] = node_indices[nn_idx[i]];
        d_best[i] = sqrt(dists[i]);
    }
}